

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonEachBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  int iVar1;
  sqlite3_index_constraint_usage *psVar2;
  long lVar3;
  uint uVar4;
  uchar *puVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int aIdx [2];
  
  aIdx[0] = -1;
  aIdx[1] = -1;
  iVar1 = pIdxInfo->nConstraint;
  iVar7 = 0;
  if (0 < iVar1) {
    puVar5 = &pIdxInfo->aConstraint->usable;
    iVar7 = 0;
    uVar6 = 0;
    uVar8 = 0;
    do {
      if (7 < ((sqlite3_index_constraint *)(puVar5 + -5))->iColumn) {
        uVar4 = ((sqlite3_index_constraint *)(puVar5 + -5))->iColumn - 8;
        uVar9 = 1 << ((byte)uVar4 & 0x1f);
        if (*puVar5 == '\0') {
          uVar8 = uVar8 | uVar9;
        }
        else if (puVar5[-1] == '\x02') {
          aIdx[uVar4] = iVar7;
          uVar6 = uVar6 | uVar9;
        }
      }
      iVar7 = iVar7 + 1;
      puVar5 = puVar5 + 0xc;
    } while (iVar1 != iVar7);
    if ((uVar8 & ~uVar6) != 0) {
      return 0x13;
    }
    lVar3 = (long)aIdx[0];
    if (lVar3 < 0) {
      iVar7 = 0;
    }
    else {
      pIdxInfo->estimatedCost = 1.0;
      psVar2 = pIdxInfo->aConstraintUsage;
      psVar2[lVar3].argvIndex = 1;
      psVar2[lVar3].omit = '\x01';
      lVar3 = (long)aIdx[1];
      if (lVar3 < 0) {
        iVar7 = 1;
      }
      else {
        psVar2[lVar3].argvIndex = 2;
        psVar2[lVar3].omit = '\x01';
        iVar7 = 3;
      }
    }
  }
  pIdxInfo->idxNum = iVar7;
  return 0;
}

Assistant:

static int jsonEachBestIndex(
  sqlite3_vtab *tab,
  sqlite3_index_info *pIdxInfo
){
  int i;                     /* Loop counter or computed array index */
  int aIdx[2];               /* Index of constraints for JSON and ROOT */
  int unusableMask = 0;      /* Mask of unusable JSON and ROOT constraints */
  int idxMask = 0;           /* Mask of usable == constraints JSON and ROOT */
  const struct sqlite3_index_constraint *pConstraint;

  /* This implementation assumes that JSON and ROOT are the last two
  ** columns in the table */
  assert( JEACH_ROOT == JEACH_JSON+1 );
  UNUSED_PARAMETER(tab);
  aIdx[0] = aIdx[1] = -1;
  pConstraint = pIdxInfo->aConstraint;
  for(i=0; i<pIdxInfo->nConstraint; i++, pConstraint++){
    int iCol;
    int iMask;
    if( pConstraint->iColumn < JEACH_JSON ) continue;
    iCol = pConstraint->iColumn - JEACH_JSON;
    assert( iCol==0 || iCol==1 );
    testcase( iCol==0 );
    iMask = 1 << iCol;
    if( pConstraint->usable==0 ){
      unusableMask |= iMask;
    }else if( pConstraint->op==SQLITE_INDEX_CONSTRAINT_EQ ){
      aIdx[iCol] = i;
      idxMask |= iMask;
    }
  }
  if( (unusableMask & ~idxMask)!=0 ){
    /* If there are any unusable constraints on JSON or ROOT, then reject
    ** this entire plan */
    return SQLITE_CONSTRAINT;
  }
  if( aIdx[0]<0 ){
    /* No JSON input.  Leave estimatedCost at the huge value that it was
    ** initialized to to discourage the query planner from selecting this
    ** plan. */
    pIdxInfo->idxNum = 0;
  }else{
    pIdxInfo->estimatedCost = 1.0;
    i = aIdx[0];
    pIdxInfo->aConstraintUsage[i].argvIndex = 1;
    pIdxInfo->aConstraintUsage[i].omit = 1;
    if( aIdx[1]<0 ){
      pIdxInfo->idxNum = 1;  /* Only JSON supplied.  Plan 1 */
    }else{
      i = aIdx[1];
      pIdxInfo->aConstraintUsage[i].argvIndex = 2;
      pIdxInfo->aConstraintUsage[i].omit = 1;
      pIdxInfo->idxNum = 3;  /* Both JSON and ROOT are supplied.  Plan 3 */
    }
  }
  return SQLITE_OK;
}